

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte *__src;
  byte bVar1;
  int a_00;
  stbi__uint32 sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  stbi_uc *psVar6;
  char *pcVar7;
  void *__ptr;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  size_t sVar11;
  byte bVar12;
  size_t __n;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ushort *src;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ushort *dest;
  char cVar20;
  uint uVar21;
  ulong uVar22;
  uint a_01;
  size_t __n_00;
  long in_FS_OFFSET;
  bool bVar23;
  byte local_a1;
  ulong local_60;
  int local_58;
  
  bVar23 = depth == 0x10;
  iVar3 = x * out_n << bVar23;
  a_00 = a->s->img_n;
  uVar15 = a_00 << bVar23;
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar23,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
LAB_0011103b:
    pcVar7 = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 != 0) {
      uVar21 = a_00 * x;
      a_01 = uVar21 * depth + 7 >> 3;
      iVar4 = stbi__mad2sizes_valid(a_01,y,a_01);
      if (iVar4 != 0) {
        if (raw_len < (a_01 + 1) * y) {
          pcVar7 = "not enough pixels";
          goto LAB_00111042;
        }
        local_60 = 0;
        __ptr = stbi__malloc_mad2(a_01,2,0);
        if (__ptr != (void *)0x0) {
          sVar2 = x;
          if (depth < 8) {
            uVar15 = 1;
            sVar2 = a_01;
          }
          uVar5 = sVar2 * uVar15;
          __n = (size_t)(int)uVar15;
          __n_00 = (size_t)(int)uVar5;
          uVar22 = 0;
          if (0 < (int)uVar15) {
            uVar22 = (ulong)uVar15;
          }
          uVar8 = 0;
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
          }
          local_a1 = 1;
          uVar14 = 0;
          do {
            if (uVar14 == y) {
              uVar15 = 1;
LAB_0011107d:
              free(__ptr);
              return uVar15;
            }
            uVar13 = 0;
            if ((uVar14 & 1) != 0) {
              uVar13 = (ulong)a_01;
            }
            bVar10 = *raw;
            if (4 < (ulong)bVar10) {
              uVar15 = (uint)(y <= uVar14);
              *(char **)(in_FS_OFFSET + -0x20) = "invalid filter";
              goto LAB_0011107d;
            }
            if (uVar14 == 0) {
              bVar10 = ""[bVar10];
            }
            src = (ushort *)(uVar13 + (long)__ptr);
            psVar6 = a->out;
            __src = raw + 1;
            if (bVar10 < 6) {
              uVar15 = (local_a1 & 1) * a_01;
              switch(bVar10) {
              case 0:
                memcpy(src,__src,__n_00);
                break;
              case 1:
                memcpy(src,__src,__n);
                lVar9 = 0;
                for (sVar11 = __n; (long)sVar11 < (long)__n_00; sVar11 = sVar11 + 1) {
                  *(byte *)((long)src + sVar11) = *(byte *)((long)src + lVar9) + raw[sVar11 + 1];
                  lVar9 = lVar9 + 1;
                }
                break;
              case 2:
                for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
                  *(stbi_uc *)((long)src + uVar13) =
                       *(char *)((long)__ptr + uVar13 + uVar15) + raw[uVar13 + 1];
                }
                break;
              case 3:
                for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
                  *(byte *)((long)src + uVar13) =
                       (*(byte *)((long)__ptr + uVar13 + uVar15) >> 1) + raw[uVar13 + 1];
                }
                lVar9 = 0;
                for (sVar11 = __n; (long)sVar11 < (long)__n_00; sVar11 = sVar11 + 1) {
                  *(stbi_uc *)((long)src + sVar11) =
                       (char)((uint)*(byte *)((long)src + lVar9) +
                              (uint)*(byte *)((long)__ptr + sVar11 + uVar15) >> 1) + raw[sVar11 + 1]
                  ;
                  lVar9 = lVar9 + 1;
                }
                break;
              case 4:
                for (uVar13 = 0; uVar22 != uVar13; uVar13 = uVar13 + 1) {
                  *(stbi_uc *)((long)src + uVar13) =
                       *(char *)((long)__ptr + uVar13 + uVar15) + raw[uVar13 + 1];
                }
                lVar9 = 0;
                for (sVar11 = __n; (long)sVar11 < (long)__n_00; sVar11 = sVar11 + 1) {
                  bVar10 = *(byte *)((long)src + lVar9);
                  bVar12 = *(byte *)((long)__ptr + sVar11 + uVar15);
                  bVar1 = *(byte *)((long)__ptr + lVar9 + (ulong)uVar15);
                  uVar18 = (uint)bVar12;
                  uVar16 = (uint)bVar10;
                  iVar4 = (((uint)bVar1 + (uint)bVar1 * 2) - uVar18) - uVar16;
                  uVar19 = (uint)bVar12;
                  uVar5 = uVar19;
                  if (uVar16 < uVar18) {
                    uVar5 = (uint)bVar10;
                  }
                  if (uVar16 >= uVar18 && uVar16 != uVar19) {
                    uVar19 = (uint)bVar10;
                  }
                  uVar16 = (uint)bVar1;
                  if ((int)uVar19 <= iVar4) {
                    uVar16 = uVar5;
                  }
                  cVar20 = (char)uVar16;
                  if (iVar4 <= (int)uVar5) {
                    cVar20 = (char)uVar19;
                  }
                  *(stbi_uc *)((long)src + sVar11) = cVar20 + raw[sVar11 + 1];
                  lVar9 = lVar9 + 1;
                }
                break;
              case 5:
                memcpy(src,__src,__n);
                lVar9 = 0;
                for (sVar11 = __n; (long)sVar11 < (long)__n_00; sVar11 = sVar11 + 1) {
                  *(byte *)((long)src + sVar11) =
                       (*(byte *)((long)src + lVar9) >> 1) + raw[sVar11 + 1];
                  lVar9 = lVar9 + 1;
                }
              }
            }
            local_58 = (int)uVar14;
            dest = (ushort *)(psVar6 + (uint)(iVar3 * local_58));
            if (depth < 8) {
              bVar10 = 1;
              if (color == 0) {
                bVar10 = ""[depth];
              }
              if (depth == 4) {
                uVar17 = 0;
                for (uVar13 = 0; uVar21 != (uint)uVar13; uVar13 = uVar13 + 1) {
                  if ((uVar13 & 1) == 0) {
                    uVar17 = (ulong)(byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar13 + local_60] = (char)(uVar17 >> 4) * bVar10;
                  uVar17 = (ulong)(byte)((char)uVar17 << 4);
                }
              }
              else if (depth == 2) {
                uVar17 = 0;
                for (uVar13 = 0; uVar21 != (uint)uVar13; uVar13 = uVar13 + 1) {
                  if ((uVar13 & 3) == 0) {
                    uVar17 = (ulong)(byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar13 + local_60] = (char)(uVar17 >> 6) * bVar10;
                  uVar17 = (ulong)(byte)((char)uVar17 << 2);
                }
              }
              else {
                bVar12 = 0;
                for (uVar13 = 0; uVar21 != (uint)uVar13; uVar13 = uVar13 + 1) {
                  if ((uVar13 & 7) == 0) {
                    bVar12 = (byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar13 + local_60] = (char)bVar12 >> 7 & bVar10;
                  bVar12 = bVar12 * '\x02';
                }
              }
              src = dest;
              if (a_00 != out_n) {
LAB_00110f9b:
                stbi__create_png_alpha_expand8((stbi_uc *)dest,(stbi_uc *)src,x,a_00);
              }
            }
            else if (depth == 8) {
              if (a_00 != out_n) goto LAB_00110f9b;
              memcpy(dest,src,(ulong)uVar21);
            }
            else if (depth == 0x10) {
              if (a_00 == out_n) {
                for (lVar9 = 0; uVar21 != (uint)lVar9; lVar9 = lVar9 + 1) {
                  *(ushort *)(psVar6 + lVar9 * 2 + local_60) = src[lVar9] << 8 | src[lVar9] >> 8;
                }
              }
              else {
                lVar9 = 0;
                if (a_00 == 1) {
                  for (; x != (stbi__uint32)lVar9; lVar9 = lVar9 + 1) {
                    *(ushort *)(psVar6 + lVar9 * 4 + local_60) = src[lVar9] << 8 | src[lVar9] >> 8;
                    (psVar6 + lVar9 * 4 + local_60 + 2)[0] = 0xff;
                    (psVar6 + lVar9 * 4 + local_60 + 2)[1] = 0xff;
                  }
                }
                else {
                  for (; x != (stbi__uint32)lVar9; lVar9 = lVar9 + 1) {
                    *(ushort *)(psVar6 + lVar9 * 8 + local_60) = *src << 8 | *src >> 8;
                    *(ushort *)(psVar6 + lVar9 * 8 + local_60 + 2) = src[1] << 8 | src[1] >> 8;
                    *(ushort *)(psVar6 + lVar9 * 8 + local_60 + 4) = src[2] << 8 | src[2] >> 8;
                    (psVar6 + lVar9 * 8 + local_60 + 6)[0] = 0xff;
                    (psVar6 + lVar9 * 8 + local_60 + 6)[1] = 0xff;
                    src = src + 3;
                  }
                }
              }
            }
            raw = __src + __n_00;
            uVar14 = uVar14 + 1;
            local_a1 = local_a1 + 1;
            local_60 = (ulong)(uint)((int)local_60 + iVar3);
          } while( true );
        }
        goto LAB_0011103b;
      }
    }
    pcVar7 = "too large";
  }
LAB_00111042:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar7;
  return 0 << bVar23;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}